

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

void Json_Extract(char *pFileName,Abc_Nam_t *pStr,Vec_Wec_t *vObjs)

{
  Vec_Wec_t *vObjs_00;
  Vec_Wec_t *pStr_00;
  FILE *__stream;
  Vec_Int_t *vArray;
  FILE *pFile;
  Vec_Wec_t *pVStack_20;
  int Count;
  Vec_Wec_t *vObjs_local;
  Abc_Nam_t *pStr_local;
  char *pFileName_local;
  
  pFile._4_4_ = 0;
  pVStack_20 = vObjs;
  vObjs_local = (Vec_Wec_t *)pStr;
  pStr_local = (Abc_Nam_t *)pFileName;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pStr_local);
  }
  else {
    fprintf(__stream,"# Data extracted from JSON file:\n");
    pStr_00 = vObjs_local;
    vObjs_00 = pVStack_20;
    vArray = Vec_WecEntry(pVStack_20,0);
    Json_Extract_rec((FILE *)__stream,(Abc_Nam_t *)pStr_00,vObjs_00,vArray,0,
                     (int *)((long)&pFile + 4));
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void Json_Extract( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs )
{
    int Count = 0;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Data extracted from JSON file:\n" );
    Json_Extract_rec( pFile, pStr, vObjs, Vec_WecEntry(vObjs, 0), 0, &Count );
    fprintf( pFile, "\n" );
    fclose( pFile );
}